

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::ComputeTargetOrder(cmGlobalGenerator *this,cmGeneratorTarget *gt,size_t *index)

{
  unsigned_long uVar1;
  bool bVar2;
  set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_> *this_00;
  reference this_01;
  cmGeneratorTarget *gt_00;
  pointer ppVar3;
  __enable_if_t<is_constructible<value_type,_pair<const_cmGeneratorTarget_*const,_unsigned_long>_&>::value,_pair<iterator,_bool>_>
  _Var4;
  cmTargetDepend *d;
  iterator __end1;
  iterator __begin1;
  TargetDependSet *__range1;
  TargetDependSet *deps;
  _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_> entry;
  __enable_if_t<is_constructible<value_type,_pair<const_cmGeneratorTarget_*const,_unsigned_long>_&>::value,_pair<iterator,_bool>_>
  insertion;
  undefined1 local_30 [8];
  value_type value;
  size_t *index_local;
  cmGeneratorTarget *gt_local;
  cmGlobalGenerator *this_local;
  
  insertion._12_4_ = 0;
  value.second = (unsigned_long)index;
  index_local = (size_t *)gt;
  gt_local = (cmGeneratorTarget *)this;
  std::pair<const_cmGeneratorTarget_*const,_unsigned_long>::
  pair<const_cmGeneratorTarget_*&,_int,_true>
            ((pair<const_cmGeneratorTarget_*const,_unsigned_long> *)local_30,
             (cmGeneratorTarget **)&index_local,(int *)&insertion.field_0xc);
  _Var4 = std::
          map<cmGeneratorTarget_const*,unsigned_long,std::less<cmGeneratorTarget_const*>,std::allocator<std::pair<cmGeneratorTarget_const*const,unsigned_long>>>
          ::insert<std::pair<cmGeneratorTarget_const*const,unsigned_long>&>
                    ((map<cmGeneratorTarget_const*,unsigned_long,std::less<cmGeneratorTarget_const*>,std::allocator<std::pair<cmGeneratorTarget_const*const,unsigned_long>>>
                      *)&this->TargetOrderIndex,
                     (pair<const_cmGeneratorTarget_*const,_unsigned_long> *)local_30);
  deps = (TargetDependSet *)_Var4.first._M_node;
  insertion.first._M_node._0_1_ = _Var4.second;
  if (((undefined1  [16])_Var4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    entry._M_node = (_Base_ptr)deps;
    this_00 = &GetTargetDirectDepends(this,(cmGeneratorTarget *)index_local)->
               super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
    ;
    __end1 = std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::
             begin(this_00);
    d = (cmTargetDepend *)
        std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::end
                  (this_00);
    while (bVar2 = std::operator!=(&__end1,(_Self *)&d), bVar2) {
      this_01 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&__end1);
      gt_00 = cmTargetDepend::operator_cast_to_cmGeneratorTarget_(this_01);
      ComputeTargetOrder(this,gt_00,(size_t *)value.second);
      std::_Rb_tree_const_iterator<cmTargetDepend>::operator++(&__end1);
    }
    uVar1 = *(unsigned_long *)value.second;
    *(unsigned_long *)value.second = uVar1 + 1;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>::
             operator->((_Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>
                         *)&deps);
    ppVar3->second = uVar1;
  }
  return;
}

Assistant:

void cmGlobalGenerator::ComputeTargetOrder(cmGeneratorTarget const* gt,
                                           size_t& index)
{
  std::map<cmGeneratorTarget const*, size_t>::value_type value(gt, 0);
  auto insertion = this->TargetOrderIndex.insert(value);
  if (!insertion.second) {
    return;
  }
  auto entry = insertion.first;

  const auto& deps = this->GetTargetDirectDepends(gt);
  for (const auto& d : deps) {
    this->ComputeTargetOrder(d, index);
  }

  entry->second = index++;
}